

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image * rf_image_color_grayscale(rf_image image)

{
  int iVar1;
  rf_image *in_RDI;
  
  in_RDI->format = 0;
  in_RDI->valid = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  if (image.valid == true) {
    iVar1 = rf_pixel_buffer_size(image.width,image.height,image.format);
    rf_image_format_to_buffer(in_RDI,image,RF_UNCOMPRESSED_GRAYSCALE,image.data,(long)iVar1);
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_image_color_grayscale(rf_image image)
{
    rf_image result = {0};

    if (image.valid)
    {
        result = rf_image_color_grayscale_to_buffer(image, image.data, rf_image_size(image));
    }

    return result;
}